

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::IsWindowHovered(ImGuiHoveredFlags flags)

{
  ImGuiID IVar1;
  ImGuiWindow *window;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiWindow *potential_parent;
  
  pIVar2 = GImGui;
  if ((flags & 0x300U) != 0) {
    __assert_fail("(flags & (ImGuiHoveredFlags_AllowWhenOverlapped | ImGuiHoveredFlags_AllowWhenDisabled)) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x1c7b,"bool ImGui::IsWindowHovered(ImGuiHoveredFlags)");
  }
  window = GImGui->HoveredWindow;
  if (window == (ImGuiWindow *)0x0) {
    return false;
  }
  if ((flags & 4U) == 0) {
    potential_parent = GImGui->CurrentWindow;
    if (potential_parent == (ImGuiWindow *)0x0) {
      __assert_fail("cur_window",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x1c84,"bool ImGui::IsWindowHovered(ImGuiHoveredFlags)");
    }
    if ((flags & 2U) != 0) {
      potential_parent = potential_parent->RootWindow;
      if ((flags & 8U) == 0) {
        potential_parent = potential_parent->RootWindowPopupTree;
      }
      if ((flags & 0x10U) != 0) {
        potential_parent = potential_parent->RootWindowDockTree;
      }
    }
    if ((flags & 1U) == 0) {
      if (window != potential_parent) {
        return false;
      }
    }
    else {
      bVar3 = IsWindowChildOf(window,potential_parent,(flags & 8U) == 0,
                              SUB41((flags & 0x10U) >> 4,0));
      if (!bVar3) {
        return false;
      }
    }
  }
  bVar3 = IsWindowContentHoverable(window,flags);
  if ((bVar3) &&
     (((((char)flags < '\0' || (IVar1 = pIVar2->ActiveId, IVar1 == 0)) ||
       (pIVar2->ActiveIdAllowOverlap != false)) || (IVar1 == window->MoveId)))) {
    return true;
  }
  return false;
}

Assistant:

bool ImGui::IsWindowHovered(ImGuiHoveredFlags flags)
{
    IM_ASSERT((flags & (ImGuiHoveredFlags_AllowWhenOverlapped | ImGuiHoveredFlags_AllowWhenDisabled)) == 0);   // Flags not supported by this function
    ImGuiContext& g = *GImGui;
    ImGuiWindow* ref_window = g.HoveredWindow;
    ImGuiWindow* cur_window = g.CurrentWindow;
    if (ref_window == NULL)
        return false;

    if ((flags & ImGuiHoveredFlags_AnyWindow) == 0)
    {
        IM_ASSERT(cur_window); // Not inside a Begin()/End()
        const bool popup_hierarchy = (flags & ImGuiHoveredFlags_NoPopupHierarchy) == 0;
        const bool dock_hierarchy = (flags & ImGuiHoveredFlags_DockHierarchy) != 0;
        if (flags & ImGuiHoveredFlags_RootWindow)
            cur_window = GetCombinedRootWindow(cur_window, popup_hierarchy, dock_hierarchy);

        bool result;
        if (flags & ImGuiHoveredFlags_ChildWindows)
            result = IsWindowChildOf(ref_window, cur_window, popup_hierarchy, dock_hierarchy);
        else
            result = (ref_window == cur_window);
        if (!result)
            return false;
    }

    if (!IsWindowContentHoverable(ref_window, flags))
        return false;
    if (!(flags & ImGuiHoveredFlags_AllowWhenBlockedByActiveItem))
        if (g.ActiveId != 0 && !g.ActiveIdAllowOverlap && g.ActiveId != ref_window->MoveId)
            return false;
    return true;
}